

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void initLayoutStruct(QLayoutStruct *sl,QFormLayoutItem *item)

{
  int iVar1;
  int iVar2;
  
  iVar1 = QFormLayoutItem::vStretch(item);
  iVar2 = (item->minSize).ht.m_i;
  sl->stretch = iVar1;
  sl->minimumSize = iVar2;
  sl->expansive = false;
  sl->empty = true;
  sl->spacing = 0;
  sl->sizeHint = (item->sizeHint).ht.m_i;
  sl->maximumSize = (item->maxSize).ht.m_i;
  iVar2 = (*item->item->_vptr_QLayoutItem[5])();
  sl->expansive = (bool)((byte)iVar2 >> 1 & 1);
  sl->empty = false;
  return;
}

Assistant:

static inline void initLayoutStruct(QLayoutStruct& sl, QFormLayoutItem* item)
{
    sl.init(item->vStretch(), item->minSize.height());
    sl.sizeHint = item->sizeHint.height();
    sl.maximumSize = item->maxSize.height();
    sl.expansive = (item->expandingDirections() & Qt::Vertical);
    sl.empty = false;
}